

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * labyrinth_chunk(player *p,wchar_t h,wchar_t w,_Bool lit,_Bool soft)

{
  undefined4 uVar1;
  int iVar2;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  chunk *pcVar3;
  _Bool _Var4;
  int16_t iVar5;
  wchar_t n_00;
  void *p_00;
  int *piVar6;
  square_conflict *psVar7;
  loc_conflict lVar8;
  loc lVar9;
  loc lVar10;
  _Bool local_a9;
  wchar_t sb;
  wchar_t sa;
  wchar_t b;
  wchar_t a;
  loc diag;
  wchar_t k_local;
  chunk_conflict *c;
  int *walls;
  int *sets;
  wchar_t n;
  int *find_state;
  loc grid;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  _Bool soft_local;
  _Bool lit_local;
  wchar_t w_local;
  wchar_t h_local;
  player *p_local;
  
  n_00 = h * w;
  register0x00000000 = (chunk *)cave_new(h + L'\x02',w + L'\x02');
  register0x00000000->depth = (int)p->depth;
  p_00 = mem_zalloc((long)n_00 << 2);
  piVar6 = (int *)mem_zalloc((long)n_00 << 2);
  draw_rectangle((chunk_conflict *)stack0xffffffffffffffa8,L'\0',L'\0',h + L'\x01',w + L'\x01',
                 FEAT_PERM,L'\0',true);
  if (soft) {
    fill_rectangle((chunk_conflict *)stack0xffffffffffffffa8,L'\x01',L'\x01',h,w,FEAT_GRANITE,L'\r')
    ;
  }
  else {
    fill_rectangle((chunk_conflict *)stack0xffffffffffffffa8,L'\x01',L'\x01',h,w,FEAT_PERM,L'\0');
  }
  for (k = L'\0'; k < n_00; k = k + L'\x01') {
    piVar6[k] = k;
    *(undefined4 *)((long)p_00 + (long)k * 4) = 0xffffffff;
  }
  for (find_state._4_4_ = L'\0'; find_state._4_4_ < h; find_state._4_4_ = find_state._4_4_ + L'\x02'
      ) {
    for (find_state._0_4_ = L'\0'; (wchar_t)find_state < w;
        find_state._0_4_ = (wchar_t)find_state + L'\x02') {
      lVar9.y = find_state._4_4_;
      lVar9.x = (wchar_t)find_state;
      diag.x = grid_to_i(lVar9,w);
      lVar10.y = find_state._4_4_;
      lVar10.x = (wchar_t)find_state;
      _b = (loc_conflict)next_grid(lVar10,L'\x03');
      *(int *)((long)p_00 + (long)diag.x * 4) = diag.x;
      square_set_feat(stack0xffffffffffffffa8,_b,FEAT_FLOOR);
      if (lit) {
        psVar7 = square(stack0xffffffffffffffa8,_b);
        flag_on_dbg(psVar7->info,3,2,"square(c, diag)->info","SQUARE_GLOW");
      }
    }
  }
  shuffle(piVar6,n_00);
  for (k = L'\0'; k < n_00; k = k + L'\x01') {
    grid.y = piVar6[k];
    i_to_grid(grid.y,w,(loc *)&find_state);
    if ((((L'\0' < (wchar_t)find_state) || (L'\0' < find_state._4_4_)) &&
        (((wchar_t)find_state <= w + L'\xfffffffe' || (find_state._4_4_ <= h + L'\xfffffffe')))) &&
       (((wchar_t)find_state % 2 != find_state._4_4_ % 2 &&
        (lab_get_adjoin(grid.y,w,&sa,&sb), pcVar3 = stack0xffffffffffffffa8,
        *(int *)((long)p_00 + (long)sa * 4) != *(int *)((long)p_00 + (long)sb * 4))))) {
      uVar1 = *(undefined4 *)((long)p_00 + (long)sa * 4);
      iVar2 = *(int *)((long)p_00 + (long)sb * 4);
      grid_00.y = find_state._4_4_;
      grid_00.x = (wchar_t)find_state;
      lVar8 = (loc_conflict)next_grid(grid_00,L'\x03');
      square_set_feat(pcVar3,lVar8,FEAT_FLOOR);
      pcVar3 = stack0xffffffffffffffa8;
      if (lit) {
        grid_01.y = find_state._4_4_;
        grid_01.x = (wchar_t)find_state;
        lVar8 = (loc_conflict)next_grid(grid_01,L'\x03');
        psVar7 = square(pcVar3,lVar8);
        flag_on_dbg(psVar7->info,3,2,"square(c, next_grid(grid, DIR_SE))->info","SQUARE_GLOW");
      }
      for (grid.x = 0; grid.x < n_00; grid.x = grid.x + 1) {
        if (*(int *)((long)p_00 + (long)grid.x * 4) == iVar2) {
          *(undefined4 *)((long)p_00 + (long)grid.x * 4) = uVar1;
        }
      }
    }
  }
  mem_free(p_00);
  mem_free(piVar6);
  lVar9 = loc(1,1);
  lVar10 = loc(stack0xffffffffffffffa8->width + L'\xfffffffe',
               stack0xffffffffffffffa8->height + L'\xfffffffe');
  piVar6 = cave_find_init(lVar9,lVar10);
  k = n_00 / 100;
  while( true ) {
    local_a9 = false;
    if (L'\0' < k) {
      local_a9 = cave_find_get_grid((loc *)&find_state,piVar6);
    }
    if (local_a9 == false) break;
    lVar8.y = find_state._4_4_;
    lVar8.x = (wchar_t)find_state;
    _Var4 = square_isempty(stack0xffffffffffffffa8,lVar8);
    if ((_Var4) &&
       (grid_02.y = find_state._4_4_, grid_02.x = (wchar_t)find_state,
       _Var4 = lab_is_tunnel((chunk_conflict *)stack0xffffffffffffffa8,grid_02), _Var4)) {
      grid_03.y = find_state._4_4_;
      grid_03.x = (wchar_t)find_state;
      place_closed_door((chunk_conflict *)stack0xffffffffffffffa8,grid_03);
      k = k + L'\xffffffff';
    }
  }
  mem_free(piVar6);
  pcVar3 = stack0xffffffffffffffa8;
  if (!lit) {
    iVar5 = Rand_normal(3,2);
    alloc_objects((chunk_conflict *)pcVar3,L'\x03',L'\x04',(int)iVar5,stack0xffffffffffffffa8->depth
                  ,'\x06');
  }
  pcVar3 = stack0xffffffffffffffa8;
  if (!soft) {
    iVar5 = Rand_normal(2,1);
    alloc_objects((chunk_conflict *)pcVar3,L'\x03',L'\x05',(int)iVar5,stack0xffffffffffffffa8->depth
                  ,'\x06');
  }
  return (chunk_conflict *)stack0xffffffffffffffa8;
}

Assistant:

static struct chunk *labyrinth_chunk(struct player *p, int h, int w, bool lit,
									 bool soft)
{
	int i, j, k;
	struct loc grid;
	int *find_state;

	/* This is the number of squares in the labyrinth */
	int n = h * w;

	/* NOTE: 'sets' and 'walls' are too large... we only need to use about
	 * 1/4 as much memory. However, in that case, the addressing math
	 * becomes a lot more complicated, so let's just stick with this
	 * because it's easier to read. */

	/* 'sets' tracks connectedness; if sets[i] == sets[j] then cells i and j
	 * are connected to each other in the maze. */
	int *sets;

	/* 'walls' is a list of wall coordinates which we will randomize */
	int *walls;

	/* The labyrinth chunk */
	struct chunk *c = cave_new(h + 2, w + 2);
	c->depth = p->depth;
	/* allocate our arrays */
	sets = mem_zalloc(n * sizeof(int));
	walls = mem_zalloc(n * sizeof(int));

	/* Bound with perma-rock */
	draw_rectangle(c, 0, 0, h + 1, w + 1, FEAT_PERM, SQUARE_NONE, true);

	/* Fill the labyrinth area with rock */
	if (soft)
		fill_rectangle(c, 1, 1, h, w, FEAT_GRANITE, SQUARE_WALL_SOLID);
	else
		fill_rectangle(c, 1, 1, h, w, FEAT_PERM, SQUARE_NONE);

	/* Initialize each wall. */
	for (i = 0; i < n; i++) {
		walls[i] = i;
		sets[i] = -1;
	}

	/* Cut out a grid of 1x1 rooms which we will call "cells" */
	for (grid.y = 0; grid.y < h; grid.y += 2) {
		for (grid.x = 0; grid.x < w; grid.x += 2) {
			int k_local = grid_to_i(grid, w);
			struct loc diag = next_grid(grid, DIR_SE);
			sets[k_local] = k_local;
			square_set_feat(c, diag, FEAT_FLOOR);
			if (lit) sqinfo_on(square(c, diag)->info, SQUARE_GLOW);
		}
	}

	/* Shuffle the walls, using Knuth's shuffle. */
	shuffle(walls, n);

	/* For each adjoining wall, look at the cells it divides. If they aren't
	 * in the same set, remove the wall and join their sets.
	 *
	 * This is a randomized version of Kruskal's algorithm. */
	for (i = 0; i < n; i++) {
		int a, b;

		j = walls[i];

		/* If this cell isn't an adjoining wall, skip it */
		i_to_grid(j, w, &grid);
		if ((grid.x < 1 && grid.y < 1) || (grid.x > w - 2 && grid.y > h - 2))
			continue;
		if (grid.x % 2 == grid.y % 2) continue;

		/* Figure out which cells are separated by this wall */
		lab_get_adjoin(j, w, &a, &b);

		/* If the cells aren't connected, kill the wall and join the sets */
		if (sets[a] != sets[b]) {
			int sa = sets[a];
			int sb = sets[b];
			square_set_feat(c, next_grid(grid, DIR_SE), FEAT_FLOOR);
			if (lit) {
				sqinfo_on(square(c, next_grid(grid, DIR_SE))->info, SQUARE_GLOW);
			}
			for (k = 0; k < n; k++) {
				if (sets[k] == sb) sets[k] = sa;
			}
		}
	}

	/* Deallocate our lists */
	mem_free(sets);
	mem_free(walls);

	/* Generate a door for every 100 squares in the labyrinth */
	find_state = cave_find_init(loc(1, 1),
		loc(c->width - 2, c->height - 2));
	i = n / 100;
	while (i > 0 && cave_find_get_grid(&grid, find_state)) {
		if (square_isempty(c, grid) && lab_is_tunnel(c, grid)) {
			place_closed_door(c, grid);
			--i;
		}
	}
	mem_free(find_state);

	/* Unlit labyrinths will have some good items */
	if (!lit)
		alloc_objects(c, SET_BOTH, TYP_GOOD, Rand_normal(3, 2),
			c->depth, ORIGIN_LABYRINTH);

	/* Hard (non-diggable) labyrinths will have some great items */
	if (!soft)
		alloc_objects(c, SET_BOTH, TYP_GREAT, Rand_normal(2, 1),
			c->depth, ORIGIN_LABYRINTH);

	return c;
}